

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

void nsync_cv_broadcast(nsync_cv *pcv)

{
  int *piVar1;
  void *pvVar2;
  uint32_t uVar3;
  int iVar4;
  nsync_dll_element_ *pnVar5;
  nsync_dll_list_ pnVar6;
  bool bVar7;
  bool local_3d;
  uint32_t old_value;
  nsync_waiter_s *p_nw;
  nsync_dll_list_ to_wake_list;
  int all_readers;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  nsync_cv *pcv_local;
  
  uVar3 = atm_load_acq_u32_(&pcv->word);
  if ((uVar3 & 2) != 0) {
    p_nw = (nsync_waiter_s *)0x0;
    nsync_spin_test_and_set_(&pcv->word,1,1,0);
    to_wake_list._4_4_ = 1;
    next = nsync_dll_first_(pcv->waiters);
    while (next != (nsync_dll_element_ *)0x0) {
      pvVar2 = next->container;
      pnVar5 = nsync_dll_next_(pcv->waiters,next);
      local_3d = false;
      if ((to_wake_list._4_4_ != 0) && (local_3d = false, (*(uint *)((long)pvVar2 + 0x30) & 1) != 0)
         ) {
        local_3d = *(lock_type **)((long)next->container + 0x40) == nsync_reader_type_;
      }
      to_wake_list._4_4_ = (uint)local_3d;
      pnVar6 = nsync_dll_remove_(pcv->waiters,next);
      pcv->waiters = pnVar6;
      if ((*(uint *)((long)pvVar2 + 0x30) & 1) != 0) {
        do {
          iVar4 = *(int *)((long)next->container + 0x48);
          piVar1 = (int *)((long)next->container + 0x48);
          LOCK();
          bVar7 = iVar4 == *piVar1;
          if (bVar7) {
            *piVar1 = iVar4 + 1;
          }
          UNLOCK();
        } while (!bVar7);
      }
      p_nw = (nsync_waiter_s *)nsync_dll_make_last_in_list_((nsync_dll_list_)p_nw,next);
      next = pnVar5;
    }
    pcv->word = 0;
    iVar4 = nsync_dll_is_empty_((nsync_dll_list_)p_nw);
    if (iVar4 == 0) {
      wake_waiters((nsync_dll_list_)p_nw,to_wake_list._4_4_);
    }
  }
  return;
}

Assistant:

void nsync_cv_broadcast (nsync_cv *pcv) {
	IGNORE_RACES_START ();
	if ((ATM_LOAD_ACQ (&pcv->word) & CV_NON_EMPTY) != 0) { /* acquire load */
		nsync_dll_element_ *p;
		nsync_dll_element_ *next;
		int all_readers;
		nsync_dll_list_ to_wake_list = NULL;   /* waiters that we will wake */
		/* acquire spinlock */
		nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
		p = NULL;
		next = NULL;
		all_readers = 1;
		/* Wake entire waiter list, which we leave empty. */
		for (p = nsync_dll_first_ (pcv->waiters); p != NULL; p = next) {
			struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
			next = nsync_dll_next_ (pcv->waiters, p);
			all_readers = all_readers && (p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
				      (DLL_WAITER (p)->l_type == nsync_reader_type_);
			pcv->waiters = nsync_dll_remove_ (pcv->waiters, p);
			if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
				uint32_t old_value;
				do {    
					old_value = ATM_LOAD (&DLL_WAITER (p)->remove_count);
				} while (!ATM_CAS (&DLL_WAITER (p)->remove_count,
						   old_value, old_value+1));
			}
			to_wake_list = nsync_dll_make_last_in_list_ (to_wake_list, p);
		}
		/* Release spinlock and mark queue empty. */
		ATM_STORE_REL (&pcv->word, 0); /* release store */
		if (!nsync_dll_is_empty_ (to_wake_list)) {    /* Wake them. */
			wake_waiters (to_wake_list, all_readers);
		}
	}
	IGNORE_RACES_END ();
}